

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

UNewTrie *
utrie_clone_63(UNewTrie *fillIn,UNewTrie *other,uint32_t *aliasData,int32_t aliasDataCapacity)

{
  UBool local_39;
  UBool isDataAllocated;
  UNewTrie *trie;
  uint32_t *puStack_28;
  int32_t aliasDataCapacity_local;
  uint32_t *aliasData_local;
  UNewTrie *other_local;
  UNewTrie *fillIn_local;
  
  if (((other == (UNewTrie *)0x0) || (other->data == (uint32_t *)0x0)) ||
     (other->isCompacted != '\0')) {
    fillIn_local = (UNewTrie *)0x0;
  }
  else {
    if ((aliasData == (uint32_t *)0x0) || (aliasDataCapacity < other->dataCapacity)) {
      trie._4_4_ = other->dataCapacity;
      puStack_28 = (uint32_t *)uprv_malloc_63((long)(other->dataCapacity << 2));
      if (puStack_28 == (uint32_t *)0x0) {
        return (UNewTrie *)0x0;
      }
      local_39 = '\x01';
    }
    else {
      local_39 = '\0';
      trie._4_4_ = aliasDataCapacity;
      puStack_28 = aliasData;
    }
    fillIn_local = utrie_open_63(fillIn,puStack_28,trie._4_4_,*other->data,other->leadUnitValue,
                                 other->isLatin1Linear);
    if (fillIn_local == (UNewTrie *)0x0) {
      uprv_free_63(puStack_28);
    }
    else {
      memcpy(fillIn_local,other,0x22080);
      memcpy(fillIn_local->data,other->data,(long)other->dataLength << 2);
      fillIn_local->dataLength = other->dataLength;
      fillIn_local->isDataAllocated = local_39;
    }
  }
  return fillIn_local;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_clone(UNewTrie *fillIn, const UNewTrie *other, uint32_t *aliasData, int32_t aliasDataCapacity) {
    UNewTrie *trie;
    UBool isDataAllocated;

    /* do not clone if other is not valid or already compacted */
    if(other==NULL || other->data==NULL || other->isCompacted) {
        return NULL;
    }

    /* clone data */
    if(aliasData!=NULL && aliasDataCapacity>=other->dataCapacity) {
        isDataAllocated=FALSE;
    } else {
        aliasDataCapacity=other->dataCapacity;
        aliasData=(uint32_t *)uprv_malloc(other->dataCapacity*4);
        if(aliasData==NULL) {
            return NULL;
        }
        isDataAllocated=TRUE;
    }

    trie=utrie_open(fillIn, aliasData, aliasDataCapacity,
                    other->data[0], other->leadUnitValue,
                    other->isLatin1Linear);
    if(trie==NULL) {
        uprv_free(aliasData);
    } else {
        uprv_memcpy(trie->index, other->index, sizeof(trie->index));
        uprv_memcpy(trie->data, other->data, (size_t)other->dataLength*4);
        trie->dataLength=other->dataLength;
        trie->isDataAllocated=isDataAllocated;
    }

    return trie;
}